

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall cornerstone::raft_server::commit_in_bg(raft_server *this)

{
  unique_lock<std::mutex> *this_00;
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  element_type *peVar4;
  long *plVar5;
  pthread_mutex_t *__mutex;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar7;
  runtime_error *prVar8;
  bool bVar9;
  ptr<cluster_config> new_conf;
  ptr<log_entry> log_entry;
  unique_lock<std::mutex> lock;
  long *local_180 [2];
  long local_170 [2];
  pthread_mutex_t *local_160;
  cluster_config local_158;
  condition_variable *local_130;
  pthread_mutex_t *local_128;
  unique_lock *local_120;
  _List_node_base *local_118;
  undefined1 local_110 [120];
  char *local_98;
  
  local_118 = (_List_node_base *)&this->commit_lock_;
  local_120 = (unique_lock *)&this->commit_cv_;
  local_128 = (pthread_mutex_t *)&this->stopping_lock_;
  local_130 = &this->ready_to_stop_cv_;
  local_160 = (pthread_mutex_t *)&this->lock_;
  this_00 = (unique_lock<std::mutex> *)(local_110 + 0x10);
  do {
    while ((uVar2 = this->sm_commit_index_, this->quick_commit_idx_ <= uVar2 ||
           (iVar6 = (*((this->log_store_).
                       super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->_vptr_log_store[2])(), CONCAT44(extraout_var,iVar6) - 1U <= uVar2))) {
      plVar5 = (long *)(((this->ctx_)._M_t.
                         super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                         .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                       event_listener_).
                       super___shared_ptr<cornerstone::raft_event_listener,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))(plVar5,3);
      }
      local_110._16_8_ = local_118;
      local_110[0x18] = 0;
      std::unique_lock<std::mutex>::lock(this_00);
      local_110[0x18] = 1;
      std::condition_variable::wait(local_120);
      if (this->stopping_ == true) {
        std::unique_lock<std::mutex>::unlock(this_00);
        __mutex = local_128;
        local_110._16_8_ = (_List_node_base *)0x0;
        local_110[0x18] = 0;
        iVar6 = pthread_mutex_lock(local_128);
        if (iVar6 == 0) {
          std::condition_variable::notify_all();
          pthread_mutex_unlock(__mutex);
          std::unique_lock<std::mutex>::~unique_lock(this_00);
          return;
        }
        std::__throw_system_error(iVar6);
      }
      std::unique_lock<std::mutex>::~unique_lock(this_00);
    }
    while( true ) {
      uVar2 = this->sm_commit_index_;
      if ((this->quick_commit_idx_ <= uVar2) ||
         (iVar6 = (*((this->log_store_).
                     super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->_vptr_log_store[2])(), CONCAT44(extraout_var_00,iVar6) - 1U <= uVar2)) break;
      this->sm_commit_index_ = this->sm_commit_index_ + 1;
      (*((this->log_store_).super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_log_store[8])
                (&local_158.servers_.
                  super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev);
      if (*(int *)&(local_158.servers_.
                    super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_prev == 2) {
        iVar6 = pthread_mutex_lock(local_160);
        if (iVar6 != 0) {
          std::__throw_system_error(iVar6);
        }
        if (local_158.servers_.
            super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev == (_List_node_base *)0x0) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar8,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        buffer::pos((buffer *)
                    local_158.servers_.
                    super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev,0);
        if (local_158.servers_.
            super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev == (_List_node_base *)0x0) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar8,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        cluster_config::deserialize
                  (&local_158,
                   (buffer *)
                   local_158.servers_.
                   super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev);
        peVar4 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_98 = "config at index %llu is committed";
        snprintf((char *)this_00,100,"config at index %llu is committed",
                 *(ulong *)local_158.log_idx_);
        local_180[0] = local_170;
        sVar7 = strlen((char *)this_00);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,this_00,local_110 + sVar7 + 0x10);
        (*peVar4->_vptr_logger[3])(peVar4,(string *)local_180);
        if (local_180[0] != local_170) {
          operator_delete(local_180[0],local_170[0] + 1);
        }
        plVar5 = *(long **)&(((this->ctx_)._M_t.
                              super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                              .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->
                            state_mgr_).
                            super___shared_ptr<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar5 + 0x18))(plVar5,local_158.log_idx_);
        this->config_changing_ = false;
        if (((this->config_).
             super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            log_idx_ < *(ulong *)local_158.log_idx_) {
          reconfigure(this,(ptr<cluster_config> *)&local_158);
        }
        bVar1 = this->catching_up_;
        if (bVar1 == true) {
          cluster_config::get_server((cluster_config *)local_110,(int)local_158.log_idx_);
          bVar9 = local_110._0_8_ != 0;
        }
        else {
          bVar9 = false;
        }
        if ((bVar1 != false) &&
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        }
        if (bVar9) {
          peVar4 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_110._16_8_ = local_110 + 0x20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)this_00,"this server is committed as one of cluster members","");
          (*peVar4->_vptr_logger[3])(peVar4,this_00);
          if ((_List_node_base *)local_110._16_8_ != (_List_node_base *)(local_110 + 0x20)) {
            operator_delete((void *)local_110._16_8_,local_110._32_8_ + 1);
          }
          this->catching_up_ = false;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.prev_log_idx_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.prev_log_idx_);
        }
        pthread_mutex_unlock(local_160);
      }
      else if (*(int *)&(local_158.servers_.
                         super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev)->_M_prev == 1) {
        if (local_158.servers_.
            super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev == (_List_node_base *)0x0) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar8,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar3 = (this->state_machine_).
                 super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_state_machine[2])
                  (peVar3,this->sm_commit_index_,
                   local_158.servers_.
                   super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev[1]._M_prev,
                   local_158.servers_.
                   super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev + 2);
      }
      snapshot_and_compact(this,this->sm_commit_index_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_158.servers_.
          super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
          ._M_impl._M_node._M_size != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_158.servers_.
                   super__List_base<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
                   ._M_impl._M_node._M_size);
      }
    }
  } while( true );
}

Assistant:

void raft_server::commit_in_bg()
{
    while (true)
    {
        try
        {
            while (quick_commit_idx_ <= sm_commit_index_ || sm_commit_index_ >= log_store_->next_slot() - 1)
            {
                // already catch up all committed logs
                if (ctx_->event_listener_)
                {
                    ctx_->event_listener_->on_event(raft_event::logs_catch_up);
                }

                std::unique_lock<std::mutex> lock(commit_lock_);
                commit_cv_.wait(lock);
                if (stopping_)
                {
                    lock.unlock();
                    lock.release();
                    {
                        auto_lock(stopping_lock_);
                        ready_to_stop_cv_.notify_all();
                    }

                    return;
                }
            }

            while (sm_commit_index_ < quick_commit_idx_ && sm_commit_index_ < log_store_->next_slot() - 1)
            {
                sm_commit_index_ += 1;
                ptr<log_entry> log_entry(log_store_->entry_at(sm_commit_index_));
                if (log_entry->get_val_type() == log_val_type::app_log)
                {
                    state_machine_->commit(sm_commit_index_, log_entry->get_buf(), log_entry->get_cookie());
                }
                else if (log_entry->get_val_type() == log_val_type::conf)
                {
                    recur_lock(lock_);
                    log_entry->get_buf().pos(0);
                    ptr<cluster_config> new_conf = cluster_config::deserialize(log_entry->get_buf());
                    l_->info(sstrfmt("config at index %llu is committed").fmt(new_conf->get_log_idx()));
                    ctx_->state_mgr_->save_config(*new_conf);
                    config_changing_ = false;
                    if (config_->get_log_idx() < new_conf->get_log_idx())
                    {
                        reconfigure(new_conf);
                    }

                    if (catching_up_ && new_conf->get_server(id_) != nilptr)
                    {
                        l_->info("this server is committed as one of cluster members");
                        catching_up_ = false;
                    }
                }

                snapshot_and_compact(sm_commit_index_);
            }
        }
        catch (std::exception& err)
        {
            l_->err(lstrfmt("background committing thread encounter err %s, exiting to protect the system")
                        .fmt(err.what()));
            ctx_->state_mgr_->system_exit(-1);
        }
    }
}